

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O2

void __thiscall
Inject::ctor_inject::ctor_inject
          (ctor_inject *this,type *service1,type *service2,type *service3,type *service4,
          type *service5)

{
  int iVar1;
  type psVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 local_168;
  undefined **local_160;
  undefined1 local_158;
  undefined8 *local_150;
  char *local_148;
  unique_id local_140;
  type *local_138;
  type *local_130;
  type *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  this->ctor_num = 5;
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = service5;
  local_130 = service4;
  local_128 = service3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x26f);
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_0015fea8;
  local_150 = &boost::unit_test::lazy_ostream::inst;
  local_148 = "";
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_d8 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(service1);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_168 = CONCAT44(extraout_var,iVar1);
  local_140 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_160,&local_e0,0x26f,1,2,&local_168,"service1->id()",&local_140,
             "id_of<impl1>::id()");
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x270);
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_0015fea8;
  local_150 = &boost::unit_test::lazy_ostream::inst;
  local_148 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_e8 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(service2);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_168 = CONCAT44(extraout_var_00,iVar1);
  local_140 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_160,&local_f0,0x270,1,2,&local_168,"service2->id()",&local_140,
             "id_of<impl1>::id()");
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x271);
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_0015fea8;
  local_150 = &boost::unit_test::lazy_ostream::inst;
  local_148 = "";
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_f8 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(local_128);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_168 = CONCAT44(extraout_var_01,iVar1);
  local_140 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_160,&local_100,0x271,1,2,&local_168,"service3->id()",&local_140,
             "id_of<impl1>::id()");
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x272);
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_0015fea8;
  local_150 = &boost::unit_test::lazy_ostream::inst;
  local_148 = "";
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_108 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(local_130);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_168 = CONCAT44(extraout_var_02,iVar1);
  local_140 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_160,&local_110,0x272,1,2,&local_168,"service4->id()",&local_140,
             "id_of<impl1>::id()");
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x273);
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_0015fea8;
  local_150 = &boost::unit_test::lazy_ostream::inst;
  local_148 = "";
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_118 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(local_138);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_168 = CONCAT44(extraout_var_03,iVar1);
  local_140 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_160,&local_120,0x273,1,2,&local_168,"service5->id()",&local_140,
             "id_of<impl1>::id()");
  return;
}

Assistant:

ctor_inject(
            context<>::ptr<service>::type service1,
            context<>::ptr<service>::type service2,
            context<>::ptr<service>::type service3,
            context<>::ptr<service>::type service4,
            context<>::ptr<service>::type service5) {
        ctor_num = 5;
        BOOST_CHECK_EQUAL(service1->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service2->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service3->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service4->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service5->id(), id_of<impl1>::id());
    }